

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj2.c
# Opt level: O1

void Exa3_ManExactSynthesis2(Bmc_EsPar_t *pPars)

{
  int *piVar1;
  ulong *puVar2;
  word wVar3;
  lit *begin;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined8 *__ptr;
  Vec_Wec_t *p;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  int *piVar10;
  void *pvVar11;
  sat_solver *s;
  byte bVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  long *end;
  ulong uVar19;
  undefined8 *puVar20;
  ulong uVar21;
  Bmc_EsPar_t *pBVar22;
  int iVar23;
  int iVar24;
  undefined8 *puVar25;
  uint uVar26;
  char *pcVar27;
  ulong uVar28;
  uint uVar29;
  timespec *begin_00;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  char cVar34;
  bool bVar35;
  int iMint;
  timespec ts;
  word pTruth [16];
  long local_1d0;
  undefined8 *local_1c8;
  uint local_1b4;
  ulong local_1b0;
  undefined8 *local_1a8;
  ulong local_1a0;
  ulong local_198;
  undefined8 *local_190;
  Bmc_EsPar_t *local_188;
  uint local_17c;
  uint local_178;
  uint local_174;
  ulong local_170;
  int *local_168;
  undefined8 *local_160;
  undefined8 *local_158;
  undefined8 *local_150;
  timespec local_148 [8];
  long local_c0;
  undefined8 *local_b8 [17];
  
  local_1b4 = 1;
  iVar4 = clock_gettime(3,local_148);
  if (iVar4 < 0) {
    lVar18 = 1;
  }
  else {
    lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                    SEXT816(CONCAT44(local_148[0].tv_nsec._4_4_,(uint)local_148[0].tv_nsec)),8);
    lVar18 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) +
             CONCAT44(local_148[0].tv_sec._4_4_,(uint)local_148[0].tv_sec) * -1000000;
  }
  Abc_TtReadHex((word *)local_b8,pPars->pTtStr);
  iVar4 = pPars->nVars;
  local_1d0 = (long)iVar4;
  if (10 < local_1d0) {
    __assert_fail("pPars->nVars <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                  ,0x527,"void Exa3_ManExactSynthesis2(Bmc_EsPar_t *)");
  }
  iVar14 = pPars->nLutSize;
  local_c0 = lVar18;
  if (6 < iVar14) {
    __assert_fail("pPars->nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                  ,0x528,"void Exa3_ManExactSynthesis2(Bmc_EsPar_t *)");
  }
  __ptr = (undefined8 *)calloc(1,0x60c8);
  *__ptr = pPars;
  *(int *)(__ptr + 1) = iVar4;
  iVar5 = pPars->nNodes;
  *(int *)((long)__ptr + 0xc) = iVar5;
  *(int *)(__ptr + 2) = iVar14;
  uVar29 = ~(-1 << ((byte)iVar14 & 0x1f));
  *(uint *)((long)__ptr + 0x14) = uVar29;
  iVar23 = iVar5 + iVar4;
  *(int *)(__ptr + 3) = iVar23;
  iVar14 = 1 << ((char)iVar4 - 6U & 0x1f);
  if (iVar4 < 7) {
    iVar14 = 1;
  }
  *(int *)((long)__ptr + 0x1c) = iVar14;
  __ptr[5] = local_b8;
  p = (Vec_Wec_t *)malloc(0x10);
  iVar14 = 8;
  if (6 < (iVar5 + iVar4) - 1U) {
    iVar14 = iVar23;
  }
  p->nSize = 0;
  p->nCap = iVar14;
  if (iVar14 == 0) {
    pVVar8 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar8 = (Vec_Int_t *)calloc((long)iVar14,0x10);
  }
  p->pArray = pVVar8;
  p->nSize = iVar23;
  __ptr[0xc17] = p;
  if (0x20 < iVar23) {
    __assert_fail("p->nObjs <= MAJ_NOBJS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                  ,0x3ad,"int Exa3_ManMarkup(Exa3_Man_t *)");
  }
  *(uint *)(__ptr + 4) = uVar29 * iVar5 + 1;
  local_188 = pPars;
  if (0 < iVar5) {
    local_158 = __ptr + 7;
    local_1c8 = __ptr + local_1d0 * 0x60 + 7;
    do {
      puVar20 = local_158;
      uVar9 = (ulong)*(uint *)(__ptr + 2);
      if (0 < (int)*(uint *)(__ptr + 2)) {
        lVar18 = 0;
        puVar25 = local_1c8;
        do {
          if (pPars->fFewerVars == 0) {
            lVar31 = 0;
LAB_005a1c3d:
            for (; lVar31 < local_1d0 - lVar18; lVar31 = lVar31 + 1) {
              iVar4 = *(int *)(__ptr + 4);
              if (iVar4 < 0) goto LAB_005a2f77;
              Vec_WecPush(p,(int)lVar31,iVar4 * 2);
              *(int *)(__ptr + 4) = iVar4 + 1;
              *(int *)((long)puVar25 + lVar31 * 4) = iVar4;
            }
          }
          else {
            iVar4 = *(int *)(__ptr + 3);
            if (lVar18 != 0 || iVar4 + -1 != (int)local_1d0) {
              lVar31 = (long)(int)((int)uVar9 + ~(uint)lVar18);
              goto LAB_005a1c3d;
            }
            iVar14 = *(int *)(__ptr + 4);
            if (iVar14 < 0) goto LAB_005a2f77;
            Vec_WecPush(p,iVar4 + -2,iVar14 * 2);
            *(int *)(__ptr + 4) = iVar14 + 1;
            *(int *)((long)puVar20 + (long)iVar4 * 4 + local_1d0 * 0x300 + -8) = iVar14;
          }
          lVar18 = lVar18 + 1;
          uVar9 = (ulong)*(int *)(__ptr + 2);
          puVar25 = puVar25 + 0x10;
          pPars = local_188;
        } while (lVar18 < (long)uVar9);
      }
      local_1d0 = local_1d0 + 1;
      local_1c8 = local_1c8 + 0x60;
    } while (local_1d0 < *(int *)(__ptr + 3));
  }
  iVar4 = *(int *)(__ptr + 4);
  pvVar11 = (void *)0x0;
  printf("The number of parameter variables = %d.\n");
  lVar31 = (long)*(int *)((long)__ptr + 0x1c);
  lVar18 = ((long)*(int *)(__ptr + 3) + 1) * lVar31;
  piVar10 = (int *)malloc(0x10);
  iVar14 = (int)lVar18;
  iVar5 = 0x10;
  if (0xe < iVar14 - 1U) {
    iVar5 = iVar14;
  }
  piVar10[1] = 0;
  *piVar10 = iVar5;
  if (iVar5 != 0) {
    pvVar11 = malloc((long)iVar5 << 3);
  }
  *(void **)(piVar10 + 2) = pvVar11;
  piVar10[1] = iVar14;
  memset(pvVar11,0,lVar18 * 8);
  __ptr[6] = piVar10;
  iVar14 = *(int *)(__ptr + 1);
  if (0 < (long)iVar14) {
    uVar29 = 1 << ((char)iVar14 - 6U & 0x1f);
    if (iVar14 < 7) {
      uVar29 = 1;
    }
    uVar9 = 0;
    do {
      if (((long)(uVar9 * lVar31) < 0) || (lVar18 <= (long)(uVar9 * lVar31))) goto LAB_005a2fb5;
      if (uVar9 < 6) {
        if (0 < (int)uVar29) {
          wVar3 = s_Truths6[uVar9];
          uVar28 = 0;
          do {
            *(word *)((long)pvVar11 + uVar28 * 8) = wVar3;
            uVar28 = uVar28 + 1;
          } while (uVar29 != uVar28);
        }
      }
      else if (0 < (int)uVar29) {
        uVar28 = 0;
        do {
          *(ulong *)((long)pvVar11 + uVar28 * 8) =
               -(ulong)((1 << ((char)uVar9 - 6U & 0x1f) & (uint)uVar28) != 0);
          uVar28 = uVar28 + 1;
        } while (uVar29 != uVar28);
      }
      uVar9 = uVar9 + 1;
      pvVar11 = (void *)((long)pvVar11 + lVar31 * 8);
    } while (uVar9 != (long)iVar14);
  }
  __ptr[6] = piVar10;
  s = sat_solver_new();
  __ptr[0xc18] = s;
  sat_solver_setnvars(s,iVar4);
  local_158 = local_b8[0];
  if ((((ulong)local_b8[0] & 1) != 0) && (iVar4 = *(int *)((long)__ptr + 0x1c), 0 < (long)iVar4)) {
    lVar18 = 0;
    do {
      local_b8[lVar18] = (undefined8 *)~(ulong)local_b8[lVar18];
      lVar18 = lVar18 + 1;
    } while (iVar4 != lVar18);
  }
  uVar9 = (ulong)*(int *)(__ptr + 1);
  if (*(int *)(__ptr + 3) <= *(int *)(__ptr + 1)) {
LAB_005a2206:
    if (1 < *(int *)(__ptr + 3)) {
      lVar18 = 8;
      lVar31 = 0;
      do {
        if (*(int *)(__ptr[0xc17] + 4) <= lVar31) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        lVar33 = *(long *)(__ptr[0xc17] + 8);
        lVar13 = (long)*(int *)(lVar33 + -4 + lVar18);
        if (lVar13 < 1) {
          __assert_fail("Vec_IntSize(vArray) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                        ,0x4e1,"int Exa3_ManAddCnfStart(Exa3_Man_t *, int)");
        }
        begin = *(lit **)(lVar33 + lVar18);
        iVar4 = sat_solver_addclause((sat_solver *)__ptr[0xc18],begin,begin + lVar13);
        if (iVar4 == 0) {
LAB_005a3012:
          __assert_fail("status",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                        ,0x52c,"void Exa3_ManExactSynthesis2(Bmc_EsPar_t *)");
        }
        lVar31 = lVar31 + 1;
        lVar18 = lVar18 + 0x10;
      } while (lVar31 < (long)*(int *)(__ptr + 3) + -1);
    }
    printf("Running exact synthesis for %d-input function with %d %d-input LUTs...\n",
           (ulong)*(uint *)(__ptr + 1),(ulong)*(uint *)((long)__ptr + 0xc),
           (ulong)*(uint *)(__ptr + 2));
    if (local_1b4 == 0xffffffff) {
LAB_005a2beb:
      if (local_1b4 == 0xffffffff) {
        printf("Realization of given %d-input function using %d %d-input LUTs:\n",
               (ulong)*(uint *)(__ptr + 1),(ulong)*(uint *)((long)__ptr + 0xc),
               (ulong)*(uint *)(__ptr + 2));
        iVar4 = *(int *)(__ptr + 3);
        uVar9 = (ulong)*(uint *)(__ptr + 1);
        if ((int)*(uint *)(__ptr + 1) < iVar4) {
          puVar20 = __ptr + (long)iVar4 * 0x60 + -0x69;
          pBVar22 = (Bmc_EsPar_t *)(long)iVar4;
          do {
            iVar4 = iVar4 + -1;
            local_188 = (Bmc_EsPar_t *)((long)&pBVar22[-1].pTtStr + 7);
            iVar14 = *(int *)((long)__ptr + 0x14);
            printf("%02d = %d\'b",local_188,(ulong)(uint)(1 << (*(byte *)(__ptr + 2) & 0x1f)));
            if (0 < (long)*(int *)((long)__ptr + 0x14)) {
              lVar18 = (long)*(int *)((long)__ptr + 0x14);
              do {
                uVar28 = (ulong)(uint)(iVar14 * (iVar4 - (int)uVar9)) + lVar18;
                iVar5 = (int)uVar28;
                if ((iVar5 < 0) || (*(int *)__ptr[0xc18] <= iVar5)) {
LAB_005a2f58:
                  __assert_fail("v >= 0 && v < s->size",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                                ,0xda,"int sat_solver_var_value(sat_solver *, int)");
                }
                lVar31 = *(long *)((int *)__ptr[0xc18] + 0x52);
                bVar12 = *(int *)(__ptr + 3) == (int)pBVar22 & (byte)local_158 ^
                         *(int *)(lVar31 + (uVar28 & 0xffffffff) * 4) == 1;
                printf("%d",(ulong)bVar12,__ptr,CONCAT71((int7)((ulong)lVar31 >> 8),bVar12));
                bVar35 = 1 < lVar18;
                lVar18 = lVar18 + -1;
              } while (bVar35);
            }
            pcVar27 = "0(";
            if (*(int *)(__ptr + 3) == (int)pBVar22) {
              pcVar27 = "1(";
            }
            if (((ulong)local_158 & 1) == 0) {
              pcVar27 = "0(";
            }
            printf(pcVar27);
            lVar18 = (long)*(int *)(__ptr + 2);
            if (0 < lVar18) {
              puVar25 = puVar20 + lVar18 * 0x10;
              do {
                iVar14 = 0;
                bVar35 = false;
                uVar9 = 0xffffffff;
                if (0 < (long)*(int *)(__ptr + 3)) {
                  uVar28 = 0;
                  do {
                    uVar29 = *(uint *)((long)puVar25 + uVar28 * 4);
                    if ((ulong)uVar29 != 0) {
                      if (((int)uVar29 < 0) || (*(int *)__ptr[0xc18] <= (int)uVar29))
                      goto LAB_005a2f58;
                      bVar35 = *(int *)(*(long *)((int *)__ptr[0xc18] + 0x52) + (ulong)uVar29 * 4)
                               == 1;
                      if (bVar35) {
                        uVar9 = uVar28 & 0xffffffff;
                      }
                      iVar14 = iVar14 + (uint)bVar35;
                    }
                    uVar28 = uVar28 + 1;
                  } while ((long)*(int *)(__ptr + 3) != uVar28);
                  bVar35 = iVar14 == 1;
                }
                if (!bVar35) {
LAB_005a2fd4:
                  __assert_fail("Count == 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                                ,0x434,"int Exa3_ManFindFanin(Exa3_Man_t *, int, int)");
                }
                iVar14 = (int)uVar9;
                if ((iVar14 < 0) || (*(int *)(__ptr + 1) <= iVar14)) {
                  pcVar27 = " %02d";
                }
                else {
                  uVar9 = (ulong)(iVar14 + 0x61);
                  pcVar27 = " %c";
                }
                printf(pcVar27,uVar9);
                puVar25 = puVar25 + -0x10;
                bVar35 = 1 < lVar18;
                lVar18 = lVar18 + -1;
              } while (bVar35);
            }
            puts(" )");
            uVar9 = (ulong)*(int *)(__ptr + 1);
            puVar20 = puVar20 + -0x60;
            pBVar22 = local_188;
          } while ((long)uVar9 < (long)local_188);
        }
      }
      sat_solver_delete((sat_solver *)__ptr[0xc18]);
      pvVar11 = (void *)__ptr[6];
      if (*(void **)((long)pvVar11 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar11 + 8));
        *(undefined8 *)((long)pvVar11 + 8) = 0;
      }
      lVar18 = local_c0;
      if (pvVar11 != (void *)0x0) {
        free(pvVar11);
      }
      piVar10 = (int *)__ptr[0xc17];
      if (0 < *piVar10) {
        lVar31 = 8;
        lVar33 = 0;
        do {
          if (*(void **)(*(long *)(piVar10 + 2) + lVar31) != (void *)0x0) {
            free(*(void **)(*(long *)(piVar10 + 2) + lVar31));
            *(undefined8 *)(*(long *)(piVar10 + 2) + lVar31) = 0;
          }
          lVar33 = lVar33 + 1;
          lVar31 = lVar31 + 0x10;
        } while (lVar33 < *piVar10);
      }
      if (*(void **)(piVar10 + 2) != (void *)0x0) {
        free(*(void **)(piVar10 + 2));
        piVar10[2] = 0;
        piVar10[3] = 0;
      }
      piVar10[0] = 0;
      piVar10[1] = 0;
      free(piVar10);
      if (__ptr != (undefined8 *)0x0) {
        free(__ptr);
      }
      iVar14 = 3;
      iVar4 = clock_gettime(3,local_148);
      if (iVar4 < 0) {
        lVar31 = -1;
      }
      else {
        lVar31 = CONCAT44(local_148[0].tv_nsec._4_4_,(uint)local_148[0].tv_nsec) / 1000 +
                 CONCAT44(local_148[0].tv_sec._4_4_,(uint)local_148[0].tv_sec) * 1000000;
      }
      Abc_Print(iVar14,"%s =","Total runtime");
      Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar31 + lVar18) / 1000000.0);
      return;
    }
    local_150 = __ptr + 7;
    local_17c = 0;
    do {
      iVar4 = clock_gettime(3,local_148);
      pBVar22 = local_188;
      if (iVar4 < 0) {
        uVar9 = 1;
      }
      else {
        lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                        SEXT816(CONCAT44(local_148[0].tv_nsec._4_4_,(uint)local_148[0].tv_nsec)),8);
        uVar9 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) +
                CONCAT44(local_148[0].tv_sec._4_4_,(uint)local_148[0].tv_sec) * -1000000;
      }
      uVar19 = (ulong)local_1b4;
      uVar28 = *(ulong *)(__ptr[5] + (long)((int)local_1b4 >> 6) * 8);
      iVar4 = *(int *)(__ptr + 1);
      if (0 < (long)iVar4) {
        lVar18 = 0;
        do {
          *(uint *)((long)__ptr + lVar18 * 4 + 0x6038) =
               (uint)((local_1b4 >> ((uint)lVar18 & 0x1f) & 1) != 0);
          lVar18 = lVar18 + 1;
        } while (iVar4 != lVar18);
      }
      sat_solver_setnvars((sat_solver *)__ptr[0xc18],
                          (*(int *)(__ptr + 2) + 1) * *(int *)((long)__ptr + 0xc) +
                          *(int *)(__ptr + 4));
      local_1b0 = (ulong)*(int *)(__ptr + 1);
      if (*(int *)(__ptr + 1) < *(int *)(__ptr + 3)) {
        local_1a8 = (undefined8 *)
                    CONCAT44(local_1a8._4_4_,(uint)((uVar28 >> (uVar19 & 0x3f) & 1) != 0));
        local_170 = uVar9;
        do {
          iVar4 = (int)local_1b0 - *(int *)(__ptr + 1);
          local_168 = (int *)CONCAT44(local_168._4_4_,*(int *)((long)__ptr + 0x14) * iVar4);
          uVar29 = *(uint *)(__ptr + 4);
          local_198 = (ulong)uVar29;
          uVar26 = (*(int *)(__ptr + 2) + 1) * iVar4;
          local_160 = (undefined8 *)(ulong)uVar26;
          local_1a0 = (ulong)(uVar26 + uVar29);
          uVar9 = local_1b0;
          if (0 < *(int *)(__ptr + 2)) {
            local_190 = (undefined8 *)(long)(int)(uVar26 + uVar29);
            iVar4 = uVar29 * 2 + uVar26 * 2;
            local_1c8 = (undefined8 *)0x0;
            do {
              if (0 < *(int *)(__ptr + 3)) {
                lVar18 = (long)local_190 + (long)local_1c8;
                lVar31 = 0;
                do {
                  lVar33 = uVar9 * 0x300 + (long)local_1c8 * 0x80;
                  if (*(int *)((long)local_150 + lVar31 * 4 + lVar33) != 0) {
                    piVar10 = (int *)((long)local_150 + lVar31 * 4 + lVar33);
                    iVar14 = *(int *)(__ptr + 4);
                    iVar5 = *(int *)(__ptr + 1);
                    iVar23 = *(int *)(__ptr + 2);
                    iVar24 = 0;
                    do {
                      iVar15 = *piVar10;
                      if ((iVar15 < 0) || (local_148[0].tv_sec._0_4_ = iVar15 * 2 + 1, lVar18 < 0))
                      goto LAB_005a2f77;
                      local_148[0].tv_sec._4_4_ = iVar4 + iVar24;
                      if (lVar31 < *(int *)(__ptr + 1)) {
                        bVar12 = 0x10;
                        end = &local_148[0].tv_nsec;
                        if (iVar24 != *(int *)((long)__ptr + lVar31 * 4 + 0x6038))
                        goto LAB_005a24e7;
                      }
                      else {
                        if (((int)lVar31 - iVar5) * (iVar23 + 1) + iVar14 + *(int *)(__ptr + 2) < 0)
                        goto LAB_005a2f77;
                        local_148[0].tv_nsec._0_4_ =
                             iVar24 + (*(int *)(__ptr + 2) +
                                      ((int)lVar31 - iVar5) * (iVar23 + 1) + iVar14) * 2 ^ 1;
                        end = (long *)((long)&local_148[0].tv_nsec + 4);
LAB_005a24e7:
                        iVar15 = sat_solver_addclause
                                           ((sat_solver *)__ptr[0xc18],(lit *)local_148,(lit *)end);
                        bVar12 = iVar15 == 0;
                      }
                      if ((bVar12 & 0xf) != 0) goto LAB_005a2519;
                      iVar24 = iVar24 + 1;
                    } while (iVar24 == 1);
                    bVar12 = 0;
LAB_005a2519:
                    uVar9 = local_1b0;
                    if (bVar12 != 0) goto LAB_005a2beb;
                  }
                  lVar31 = lVar31 + 1;
                } while (lVar31 < *(int *)(__ptr + 3));
              }
              local_1c8 = (undefined8 *)((long)local_1c8 + 1);
              iVar4 = iVar4 + 2;
            } while ((long)local_1c8 < (long)*(int *)(__ptr + 2));
          }
          iVar5 = (int)local_198;
          iVar4 = (int)local_160;
          uVar28 = local_1a0;
          iVar14 = 0;
          do {
            if (((*(int *)(__ptr + 3) + -1 != (int)uVar9) || (iVar14 != (int)local_1a8)) &&
               (-1 < *(int *)((long)__ptr + 0x14))) {
              uVar29 = 0;
              do {
                cVar34 = '\x16';
                if (iVar14 != 1 || uVar29 != 0) {
                  iVar23 = *(int *)(__ptr + 2);
                  if ((long)iVar23 < 1) {
                    uVar19 = 0;
                    iVar24 = 0;
                  }
                  else {
                    uVar32 = 0;
                    iVar15 = iVar5 * 2 + iVar4 * 2;
                    do {
                      if ((int)((int)uVar28 + (uint)uVar32) < 0) goto LAB_005a2f77;
                      uVar19 = uVar32 + 1;
                      *(uint *)((long)&local_148[0].tv_sec + uVar32 * 4) =
                           iVar15 + (uint)((uVar29 >> ((uint)uVar32 & 0x1f) & 1) != 0);
                      iVar15 = iVar15 + 2;
                      uVar32 = uVar19;
                      iVar24 = iVar23;
                    } while ((long)iVar23 != uVar19);
                  }
                  iVar15 = (int)uVar19;
                  if (*(int *)(__ptr + 3) + -1 != (int)uVar9) {
                    iVar24 = iVar24 + (int)uVar28;
                    if (iVar24 < 0) goto LAB_005a2f77;
                    iVar15 = iVar15 + 1;
                    *(uint *)((long)&local_148[0].tv_sec + (uVar19 & 0xffffffff) * 4) =
                         iVar14 + iVar24 * 2 ^ 1;
                  }
                  if (uVar29 != 0) {
                    if ((int)(uVar29 + (int)local_168) < 0) goto LAB_005a2f77;
                    lVar18 = (long)iVar15;
                    iVar15 = iVar15 + 1;
                    *(uint *)((long)&local_148[0].tv_sec + lVar18 * 4) =
                         iVar14 + (uVar29 + (int)local_168) * 2;
                  }
                  if (iVar23 + 2 < iVar15) {
                    __assert_fail("nLits <= p->nLutSize+2",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                                  ,0x518,"int Exa3_ManAddCnf(Exa3_Man_t *, int)");
                  }
                  iVar23 = sat_solver_addclause
                                     ((sat_solver *)__ptr[0xc18],(lit *)local_148,
                                      (lit *)((long)&local_148[0].tv_sec + (long)iVar15 * 4));
                  cVar34 = iVar23 == 0;
                }
                if ((cVar34 != '\x16') && (cVar34 != '\0')) goto LAB_005a2beb;
                bVar35 = (int)uVar29 < *(int *)((long)__ptr + 0x14);
                uVar28 = local_1a0;
                uVar29 = uVar29 + 1;
              } while (bVar35);
            }
            bVar35 = iVar14 == 0;
            iVar14 = iVar14 + 1;
          } while (bVar35);
          local_1b0 = uVar9 + 1;
          pBVar22 = local_188;
          uVar9 = local_170;
        } while ((long)local_1b0 < (long)*(int *)(__ptr + 3));
      }
      *(int *)(__ptr + 4) =
           *(int *)(__ptr + 4) + (*(int *)(__ptr + 2) + 1) * *(int *)((long)__ptr + 0xc);
      iVar4 = sat_solver_solve((sat_solver *)__ptr[0xc18],(lit *)0x0,(lit *)0x0,0,0,0,0);
      uVar29 = local_17c;
      if (pBVar22->fVerbose != 0) {
        printf("Iter %3d : ",(ulong)local_17c);
        Extra_PrintBinary(_stdout,&local_1b4,*(int *)(__ptr + 1));
        printf("  Var =%5d  ",(ulong)*(uint *)(__ptr + 4));
        uVar26 = sat_solver_nclauses((sat_solver *)__ptr[0xc18]);
        printf("Cla =%6d  ",(ulong)uVar26);
        uVar26 = sat_solver_nconflicts((sat_solver *)__ptr[0xc18]);
        printf("Conf =%9d  ",(ulong)uVar26);
        iVar5 = 3;
        iVar14 = clock_gettime(3,local_148);
        if (iVar14 < 0) {
          lVar18 = -1;
        }
        else {
          lVar18 = CONCAT44(local_148[0].tv_nsec._4_4_,(uint)local_148[0].tv_nsec) / 1000 +
                   CONCAT44(local_148[0].tv_sec._4_4_,(uint)local_148[0].tv_sec) * 1000000;
        }
        Abc_Print(iVar5,"%s =","Time");
        Abc_Print(iVar5,"%9.2f sec\n",(double)(long)(lVar18 + uVar9) / 1000000.0);
      }
      if (iVar4 == -1) {
        puts("The problem has no solution.");
        goto LAB_005a2beb;
      }
      uVar9 = (ulong)*(int *)(__ptr + 1);
      uVar26 = *(uint *)(__ptr + 3);
      local_17c = uVar29;
      local_170 = uVar9;
      if (*(int *)(__ptr + 1) < (int)uVar26) {
        uVar29 = *(uint *)(__ptr + 2);
        uVar17 = *(uint *)((long)__ptr + 0x14);
        local_1a8 = (undefined8 *)(ulong)uVar17;
        puVar20 = local_150 + uVar9 * 0x60;
        local_190 = (undefined8 *)CONCAT44(local_190._4_4_,1);
        do {
          if (0 < (int)uVar29) {
            uVar28 = 0;
            puVar25 = puVar20;
            do {
              iVar14 = 0;
              bVar35 = false;
              uVar19 = 0xffffffff;
              iVar4 = -1;
              if (0 < (int)uVar26) {
                uVar32 = 0;
                do {
                  uVar16 = *(uint *)((long)puVar25 + uVar32 * 4);
                  if ((ulong)uVar16 != 0) {
                    if (((int)uVar16 < 0) || (*(int *)__ptr[0xc18] <= (int)uVar16))
                    goto LAB_005a2f58;
                    bVar35 = *(int *)(*(long *)((int *)__ptr[0xc18] + 0x52) + (ulong)uVar16 * 4) ==
                             1;
                    if (bVar35) {
                      uVar19 = uVar32 & 0xffffffff;
                    }
                    iVar14 = iVar14 + (uint)bVar35;
                  }
                  iVar4 = (int)uVar19;
                  uVar32 = uVar32 + 1;
                } while (uVar26 != uVar32);
                bVar35 = iVar14 == 1;
              }
              if (!bVar35) goto LAB_005a2fd4;
              uVar16 = iVar4 * *(int *)((long)__ptr + 0x1c);
              if (((int)uVar16 < 0) || (*(int *)(__ptr[6] + 4) <= (int)uVar16)) goto LAB_005a2fb5;
              (&local_148[0].tv_sec)[uVar28] = (ulong)uVar16 * 8 + *(long *)(__ptr[6] + 8);
              uVar28 = uVar28 + 1;
              puVar25 = puVar25 + 0x10;
            } while (uVar28 != uVar29);
          }
          uVar16 = *(uint *)((long)__ptr + 0x1c);
          uVar28 = (ulong)uVar16;
          uVar6 = uVar16 * (int)uVar9;
          if ((int)uVar6 < 0) goto LAB_005a2fb5;
          iVar4 = *(int *)(__ptr[6] + 4);
          if (iVar4 <= (int)uVar6) goto LAB_005a2fb5;
          lVar18 = *(long *)(__ptr[6] + 8);
          local_198 = uVar9;
          local_160 = puVar20;
          if (0 < (int)uVar16) {
            memset((void *)(lVar18 + (ulong)uVar6 * 8),0,uVar28 * 8);
          }
          if (0 < (int)local_1a8) {
            uVar6 = uVar26 * uVar16;
            if ((int)local_190 < 0) goto LAB_005a2f58;
            piVar10 = (int *)__ptr[0xc18];
            pvVar11 = (void *)(lVar18 + (ulong)uVar6 * 8);
            local_1a0 = uVar28 * 8;
            iVar5 = (int)local_198;
            uVar9 = (ulong)(uint)((iVar5 - (int)local_170) * (int)local_1a8);
            iVar14 = *piVar10;
            uVar19 = 1;
            local_1b0 = uVar9;
            local_168 = piVar10;
            do {
              uVar7 = (int)uVar9 + (uint)uVar19;
              if (iVar14 <= (int)uVar7) goto LAB_005a2f58;
              if (*(int *)(*(long *)(piVar10 + 0x52) + (ulong)uVar7 * 4) == 1) {
                if ((int)uVar6 < 0 || iVar4 <= (int)uVar6) goto LAB_005a2fb5;
                if (0 < (int)uVar16) {
                  memset(pvVar11,0xff,local_1a0);
                  piVar10 = local_168;
                  uVar9 = local_1b0;
                }
                if (0 < (int)uVar29) {
                  uVar32 = 0;
                  do {
                    lVar31 = (&local_148[0].tv_sec)[uVar32];
                    if (((uint)uVar19 >> ((uint)uVar32 & 0x1f) & 1) == 0) {
                      if (0 < (int)uVar16) {
                        uVar21 = 0;
                        do {
                          puVar2 = (ulong *)((long)pvVar11 + uVar21 * 8);
                          *puVar2 = *puVar2 & ~*(ulong *)(lVar31 + uVar21 * 8);
                          uVar21 = uVar21 + 1;
                        } while (uVar28 != uVar21);
                      }
                    }
                    else if (0 < (int)uVar16) {
                      uVar21 = 0;
                      do {
                        puVar2 = (ulong *)((long)pvVar11 + uVar21 * 8);
                        *puVar2 = *puVar2 & *(ulong *)(lVar31 + uVar21 * 8);
                        uVar21 = uVar21 + 1;
                      } while (uVar28 != uVar21);
                    }
                    uVar32 = uVar32 + 1;
                  } while (uVar32 != uVar29);
                }
                if (0 < (int)uVar16) {
                  uVar32 = 0;
                  do {
                    puVar2 = (ulong *)(lVar18 + (ulong)(uVar16 * iVar5) * 8 + uVar32 * 8);
                    *puVar2 = *puVar2 | *(ulong *)((long)pvVar11 + uVar32 * 8);
                    uVar32 = uVar32 + 1;
                  } while (uVar28 != uVar32);
                }
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar17 + 1);
          }
          uVar9 = local_198 + 1;
          local_190 = (undefined8 *)CONCAT44(local_190._4_4_,(int)local_190 + (int)local_1a8);
          puVar20 = local_160 + 0x60;
        } while (uVar26 != (uint)uVar9);
      }
      uVar29 = (uVar26 - 1) * *(int *)((long)__ptr + 0x1c);
      if (((int)uVar29 < 0) || (*(int *)(__ptr[6] + 4) <= (int)uVar29)) {
LAB_005a2fb5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      uVar26 = 1 << ((byte)local_170 - 6 & 0x1f);
      if ((int)local_170 < 7) {
        uVar26 = 1;
      }
      uVar17 = 0xffffffff;
      if (0 < (int)uVar26) {
        iVar4 = 0;
        uVar9 = 0;
        do {
          uVar28 = *(ulong *)((ulong)uVar29 * 8 + *(long *)(__ptr[6] + 8) + uVar9 * 8);
          uVar19 = *(ulong *)(__ptr[5] + uVar9 * 8);
          if (uVar28 != uVar19) {
            uVar19 = uVar19 ^ uVar28;
            bVar35 = (int)uVar19 == 0;
            uVar9 = uVar19 >> 0x20;
            if (!bVar35) {
              uVar9 = uVar19;
            }
            iVar5 = (uint)bVar35 * 0x20;
            iVar14 = iVar5 + 0x10;
            uVar28 = uVar9 >> 0x10;
            if ((short)uVar9 != 0) {
              iVar14 = iVar5;
              uVar28 = uVar9;
            }
            iVar5 = iVar14 + 8;
            uVar9 = uVar28 >> 8;
            if ((char)uVar28 != '\0') {
              iVar5 = iVar14;
              uVar9 = uVar28;
            }
            iVar14 = iVar5 + 4;
            uVar28 = uVar9 >> 4;
            if ((uVar9 & 0xf) != 0) {
              iVar14 = iVar5;
              uVar28 = uVar9;
            }
            uVar29 = (uint)(uVar28 >> 2) & 0x3fffffff;
            iVar5 = iVar14 + 2;
            if ((uVar28 & 3) != 0) {
              uVar29 = (uint)uVar28;
              iVar5 = iVar14;
            }
            uVar17 = ((~uVar29 & 1) + iVar5) - iVar4;
            break;
          }
          uVar9 = uVar9 + 1;
          iVar4 = iVar4 + -0x40;
        } while (uVar26 != uVar9);
      }
      if (1 << ((byte)local_170 & 0x1f) <= (int)uVar17) {
        __assert_fail("iMint < (1 << p->nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                      ,0x451,"int Exa3_ManEval(Exa3_Man_t *)");
      }
      local_17c = local_17c + 1;
      local_1b4 = uVar17;
      if (uVar17 == 0xffffffff) goto LAB_005a2beb;
    } while( true );
  }
  local_198 = CONCAT44(local_198._4_4_,local_188->fOnlyAnd);
  local_190 = __ptr + 7;
  local_168 = (int *)(__ptr + uVar9 * 0x60 + 7);
  local_1a8 = __ptr + uVar9 * 0x60 + 0x17;
LAB_005a1e72:
  local_1b0 = CONCAT44(local_1b0._4_4_,
                       ((int)uVar9 - *(int *)(__ptr + 1)) * *(int *)((long)__ptr + 0x14));
  local_1a0 = uVar9;
  if (0 < *(int *)(__ptr + 2)) {
    uVar9 = 0;
    puVar20 = local_1a8;
    piVar10 = local_168;
LAB_005a1ea1:
    begin_00 = local_148;
    iVar4 = *(int *)(__ptr + 3);
    if ((long)iVar4 < 1) {
      uVar29 = 0;
    }
    else {
      lVar18 = 0;
      uVar29 = 0;
      do {
        iVar14 = piVar10[lVar18];
        if (iVar14 != 0) {
          if (iVar14 < 0) goto LAB_005a2f77;
          lVar31 = (long)(int)uVar29;
          uVar29 = uVar29 + 1;
          *(int *)((long)&local_148[0].tv_sec + lVar31 * 4) = iVar14 * 2;
        }
        lVar18 = lVar18 + 1;
      } while (iVar4 != lVar18);
    }
    if ((int)uVar29 < 1) {
      __assert_fail("nLits > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                    ,0x4a3,"int Exa3_ManAddCnfStart(Exa3_Man_t *, int)");
    }
    uVar28 = (ulong)uVar29;
    iVar4 = sat_solver_addclause
                      ((sat_solver *)__ptr[0xc18],(lit *)begin_00,
                       (lit *)((long)&local_148[0].tv_sec + uVar28 * 4));
    if (iVar4 == 0) {
      uVar29 = 1;
    }
    else {
      uVar19 = 0;
      uVar32 = uVar28;
      do {
        uVar21 = uVar19 + 1;
        if (uVar21 < uVar28) {
          uVar30 = 1;
          do {
            uVar29 = *(uint *)((long)&local_148[0].tv_sec + uVar19 * 4);
            if ((int)uVar29 < 0) {
LAB_005a2f96:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            local_178 = uVar29 ^ 1;
            uVar29 = *(uint *)((long)&begin_00->tv_sec + uVar30 * 4);
            if ((int)uVar29 < 0) goto LAB_005a2f96;
            local_174 = uVar29 ^ 1;
            iVar4 = sat_solver_addclause
                              ((sat_solver *)__ptr[0xc18],(lit *)&local_178,(lit *)&local_170);
            if (iVar4 == 0) goto LAB_005a2086;
            uVar30 = uVar30 + 1;
          } while (uVar32 != uVar30);
        }
        uVar32 = uVar32 - 1;
        begin_00 = (timespec *)((long)&begin_00->tv_sec + 4);
        uVar19 = uVar21;
      } while (uVar21 != uVar28);
      uVar29 = 5;
      if ((uVar9 != *(int *)(__ptr + 2) - 1) && (uVar29 = 0, 0 < *(int *)(__ptr + 3))) {
        lVar18 = 0;
        puVar25 = puVar20;
        do {
          lVar31 = local_1a0 * 0x300 + uVar9 * 0x80;
          if ((*(int *)((long)local_190 + lVar18 * 4 + lVar31) != 0) &&
             (lVar18 < *(int *)(__ptr + 3))) {
            piVar1 = (int *)((long)local_190 + lVar18 * 4 + lVar31);
            lVar31 = 0;
            do {
              iVar4 = *(int *)((long)puVar25 + lVar31 * 4);
              if (iVar4 != 0) {
                iVar14 = *piVar1;
                if ((iVar14 < 0) || (local_178 = iVar14 * 2 + 1, iVar4 < 0)) goto LAB_005a2f77;
                local_174 = iVar4 * 2 + 1;
                iVar4 = sat_solver_addclause
                                  ((sat_solver *)__ptr[0xc18],(lit *)&local_178,(lit *)&local_170);
                if (iVar4 == 0) goto LAB_005a2086;
              }
              lVar31 = lVar31 + 1;
            } while ((int)lVar18 + (int)lVar31 < *(int *)(__ptr + 3));
          }
          lVar18 = lVar18 + 1;
          puVar25 = (undefined8 *)((long)puVar25 + 4);
        } while (lVar18 < *(int *)(__ptr + 3));
      }
    }
    goto LAB_005a209d;
  }
LAB_005a20e1:
  uVar29 = 0;
  if (*(int *)(__ptr + 2) != 2) goto LAB_005a21d5;
  iVar4 = (int)local_1b0;
  if ((int)local_1b0 < -1) {
LAB_005a2f77:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  local_1b0 = CONCAT44(local_1b0._4_4_,(int)local_1b0 * 2);
  uVar26 = iVar4 * 2 + 2;
  uVar17 = iVar4 * 2 + 6;
  iVar14 = 3;
  do {
    local_148[0].tv_sec._0_4_ = iVar14 == 2 | uVar26;
    local_148[0].tv_sec._4_4_ = (uint)(iVar14 == 1) | iVar4 * 2 + 4U;
    local_148[0].tv_nsec._0_4_ = iVar14 != 3 | uVar17;
    iVar5 = sat_solver_addclause
                      ((sat_solver *)__ptr[0xc18],(lit *)local_148,
                       (lit *)((long)&local_148[0].tv_nsec + 4));
    uVar29 = 1;
    if (iVar5 == 0) goto LAB_005a21d5;
    iVar14 = iVar14 + -1;
  } while (iVar14 != 0);
  if ((int)local_198 != 0) {
    local_148[0].tv_sec._0_4_ = uVar26 | 1;
    local_148[0].tv_sec._4_4_ = (int)local_1b0 + 5;
    local_148[0].tv_nsec._0_4_ = uVar17;
    iVar4 = sat_solver_addclause
                      ((sat_solver *)__ptr[0xc18],(lit *)local_148,
                       (lit *)((long)&local_148[0].tv_nsec + 4));
    if (iVar4 == 0) goto LAB_005a21d5;
  }
  uVar29 = 0;
LAB_005a21d5:
  if ((uVar29 & 3) != 0) goto LAB_005a3012;
  uVar9 = local_1a0 + 1;
  local_168 = local_168 + 0xc0;
  local_1a8 = local_1a8 + 0x60;
  if ((long)*(int *)(__ptr + 3) <= (long)uVar9) goto LAB_005a2206;
  goto LAB_005a1e72;
LAB_005a2086:
  uVar29 = 1;
LAB_005a209d:
  if (uVar29 != 0) {
    if (uVar29 != 5) goto LAB_005a21d5;
    goto LAB_005a20e1;
  }
  uVar9 = uVar9 + 1;
  piVar10 = piVar10 + 0x20;
  puVar20 = puVar20 + 0x10;
  if ((long)*(int *)(__ptr + 2) <= (long)uVar9) goto LAB_005a20e1;
  goto LAB_005a1ea1;
}

Assistant:

void Exa3_ManExactSynthesis2( Bmc_EsPar_t * pPars )
{
    int i, status, iMint = 1;
    abctime clkTotal = Abc_Clock();
    Exa3_Man_t * p; int fCompl = 0;
    word pTruth[16]; Abc_TtReadHex( pTruth, pPars->pTtStr );
    assert( pPars->nVars <= 10 );
    assert( pPars->nLutSize <= 6 );
    p = Exa3_ManAlloc( pPars, pTruth );
    if ( pTruth[0] & 1 ) { fCompl = 1; Abc_TtNot( pTruth, p->nWords ); }
    status = Exa3_ManAddCnfStart( p, pPars->fOnlyAnd );
    assert( status );
    printf( "Running exact synthesis for %d-input function with %d %d-input LUTs...\n", p->nVars, p->nNodes, p->nLutSize );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Exa3_ManAddCnf( p, iMint ) )
            break;
        status = sat_solver_solve( p->pSat, NULL, NULL, 0, 0, 0, 0 );
        if ( pPars->fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", sat_solver_nclauses(p->pSat) );
            printf( "Conf =%9d  ", sat_solver_nconflicts(p->pSat) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == l_False )
        {
            printf( "The problem has no solution.\n" );
            break;
        }
        iMint = Exa3_ManEval( p );
    }
    if ( iMint == -1 )
        Exa3_ManPrintSolution( p, fCompl );
    Exa3_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
}